

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exporter.cpp
# Opt level: O0

aiExportDataBlob * __thiscall
Assimp::Exporter::ExportToBlob
          (Exporter *this,aiScene *pScene,char *pFormatId,uint pPreprocessing,
          ExportProperties *pProperties)

{
  aiReturn aVar1;
  BlobIOSystem *this_00;
  char *pPath;
  aiExportDataBlob *paVar2;
  shared_ptr<Assimp::IOSystem> *num_bytes;
  shared_ptr<Assimp::IOSystem> local_70 [2];
  BlobIOSystem *local_50;
  BlobIOSystem *blobio;
  shared_ptr<Assimp::IOSystem> old;
  ExportProperties *pProperties_local;
  uint pPreprocessing_local;
  char *pFormatId_local;
  aiScene *pScene_local;
  Exporter *this_local;
  
  old.super___shared_ptr<Assimp::IOSystem,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pProperties;
  if (this->pimpl != (ExporterPimpl *)0x0) {
    if (this->pimpl->blob != (aiExportDataBlob *)0x0) {
      paVar2 = this->pimpl->blob;
      if (paVar2 != (aiExportDataBlob *)0x0) {
        aiExportDataBlob::~aiExportDataBlob(paVar2);
        operator_delete(paVar2,0x420);
      }
      this->pimpl->blob = (aiExportDataBlob *)0x0;
    }
    num_bytes = &this->pimpl->mIOSystem;
    std::shared_ptr<Assimp::IOSystem>::shared_ptr((shared_ptr<Assimp::IOSystem> *)&blobio,num_bytes)
    ;
    this_00 = (BlobIOSystem *)
              Intern::AllocateFromAssimpHeap::operator_new
                        ((AllocateFromAssimpHeap *)0x68,(size_t)num_bytes);
    BlobIOSystem::BlobIOSystem(this_00);
    local_50 = this_00;
    std::shared_ptr<Assimp::IOSystem>::shared_ptr<Assimp::BlobIOSystem,void>(local_70,this_00);
    std::shared_ptr<Assimp::IOSystem>::operator=(&this->pimpl->mIOSystem,local_70);
    std::shared_ptr<Assimp::IOSystem>::~shared_ptr(local_70);
    pPath = BlobIOSystem::GetMagicFileName(local_50);
    aVar1 = Export(this,pScene,pFormatId,pPath,pPreprocessing,
                   (ExportProperties *)
                   old.super___shared_ptr<Assimp::IOSystem,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
    if (aVar1 == aiReturn_SUCCESS) {
      paVar2 = BlobIOSystem::GetBlobChain(local_50);
      this->pimpl->blob = paVar2;
      std::shared_ptr<Assimp::IOSystem>::operator=
                (&this->pimpl->mIOSystem,(shared_ptr<Assimp::IOSystem> *)&blobio);
      this_local = (Exporter *)this->pimpl->blob;
    }
    else {
      std::shared_ptr<Assimp::IOSystem>::operator=
                (&this->pimpl->mIOSystem,(shared_ptr<Assimp::IOSystem> *)&blobio);
      this_local = (Exporter *)0x0;
    }
    std::shared_ptr<Assimp::IOSystem>::~shared_ptr((shared_ptr<Assimp::IOSystem> *)&blobio);
    return (aiExportDataBlob *)this_local;
  }
  __assert_fail("nullptr != pimpl",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Common/Exporter.cpp"
                ,0x129,
                "const aiExportDataBlob *Assimp::Exporter::ExportToBlob(const aiScene *, const char *, unsigned int, const ExportProperties *)"
               );
}

Assistant:

const aiExportDataBlob* Exporter::ExportToBlob( const aiScene* pScene, const char* pFormatId,
                                                unsigned int pPreprocessing, const ExportProperties* pProperties) {
	ai_assert(nullptr != pimpl);
    if (pimpl->blob) {
        delete pimpl->blob;
        pimpl->blob = nullptr;
    }

    std::shared_ptr<IOSystem> old = pimpl->mIOSystem;
    BlobIOSystem* blobio = new BlobIOSystem();
    pimpl->mIOSystem = std::shared_ptr<IOSystem>( blobio );

    if (AI_SUCCESS != Export(pScene,pFormatId,blobio->GetMagicFileName(), pPreprocessing, pProperties)) {
        pimpl->mIOSystem = old;
        return nullptr;
    }

    pimpl->blob = blobio->GetBlobChain();
    pimpl->mIOSystem = old;

    return pimpl->blob;
}